

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlNewPropInternal(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value,int eatname)

{
  xmlDictPtr pxVar1;
  int iVar2;
  xmlNodePtr attr;
  _xmlDoc *p_Var3;
  xmlNodePtr pxVar4;
  _xmlNode *p_Var5;
  _xmlNode *p_Var6;
  xmlRegisterNodeFunc *pp_Var7;
  
  if ((node == (xmlNodePtr)0x0) || (node->type == XML_ELEMENT_NODE)) {
    attr = (xmlNodePtr)(*xmlMalloc)(0x60);
    if (attr == (xmlNodePtr)0x0) {
      if ((eatname == 1) &&
         ((((node == (xmlNodePtr)0x0 || (node->doc == (_xmlDoc *)0x0)) ||
           (pxVar1 = node->doc->dict, pxVar1 == (xmlDictPtr)0x0)) ||
          (iVar2 = xmlDictOwns(pxVar1,name), iVar2 == 0)))) {
        (*xmlFree)(name);
      }
      attr = (xmlNodePtr)0x0;
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building attribute");
    }
    else {
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlNode *)0x0;
      attr->content = (xmlChar *)0x0;
      attr->properties = (_xmlAttr *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->ns = (xmlNs *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->type = XML_ATTRIBUTE_NODE;
      attr->parent = node;
      if (node == (xmlNodePtr)0x0) {
        p_Var3 = (_xmlDoc *)0x0;
      }
      else {
        p_Var3 = node->doc;
        attr->doc = p_Var3;
      }
      attr->ns = ns;
      if (eatname == 0) {
        if ((p_Var3 == (_xmlDoc *)0x0) || (p_Var3->dict == (xmlDictPtr)0x0)) {
          name = xmlStrdup(name);
        }
        else {
          name = xmlDictLookup(p_Var3->dict,name,-1);
        }
      }
      attr->name = name;
      if (value != (xmlChar *)0x0) {
        pxVar4 = xmlNewText(value);
        if (pxVar4 != (xmlNodePtr)0x0) {
          pxVar4->doc = p_Var3;
        }
        attr->children = pxVar4;
        attr->last = (_xmlNode *)0x0;
        if (pxVar4 != (xmlNodePtr)0x0) {
          do {
            p_Var5 = pxVar4;
            p_Var5->parent = attr;
            pxVar4 = p_Var5->next;
          } while (p_Var5->next != (_xmlNode *)0x0);
          attr->last = p_Var5;
        }
      }
      if (node != (xmlNodePtr)0x0) {
        p_Var5 = (_xmlNode *)node->properties;
        if ((_xmlNode *)node->properties == (_xmlNode *)0x0) {
          node->properties = (_xmlAttr *)attr;
        }
        else {
          do {
            p_Var6 = p_Var5;
            p_Var5 = p_Var6->next;
          } while (p_Var6->next != (_xmlNode *)0x0);
          p_Var6->next = attr;
          attr->prev = p_Var6;
        }
      }
      if ((node != (xmlNodePtr)0x0 && value != (xmlChar *)0x0) &&
         (iVar2 = xmlIsID(node->doc,node,(xmlAttrPtr)attr), iVar2 == 1)) {
        xmlAddID((xmlValidCtxtPtr)0x0,node->doc,value,(xmlAttrPtr)attr);
      }
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var7 = __xmlRegisterNodeDefaultValue(), *pp_Var7 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var7 = __xmlRegisterNodeDefaultValue();
        (**pp_Var7)(attr);
      }
    }
  }
  else {
    if ((eatname == 1) &&
       (((node->doc == (_xmlDoc *)0x0 || (pxVar1 = node->doc->dict, pxVar1 == (xmlDictPtr)0x0)) ||
        (iVar2 = xmlDictOwns(pxVar1,name), iVar2 == 0)))) {
      (*xmlFree)(name);
    }
    attr = (xmlNodePtr)0x0;
  }
  return (xmlAttrPtr)attr;
}

Assistant:

static xmlAttrPtr
xmlNewPropInternal(xmlNodePtr node, xmlNsPtr ns,
                   const xmlChar * name, const xmlChar * value,
                   int eatname)
{
    xmlAttrPtr cur;
    xmlDocPtr doc = NULL;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE)) {
        if ((eatname == 1) &&
	    ((node->doc == NULL) || (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL) {
        if ((eatname == 1) &&
	    ((node == NULL) || (node->doc == NULL) ||
             (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        xmlTreeErrMemory("building attribute");
        return (NULL);
    }
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    cur->parent = node;
    if (node != NULL) {
        doc = node->doc;
        cur->doc = doc;
    }
    cur->ns = ns;

    if (eatname == 0) {
        if ((doc != NULL) && (doc->dict != NULL))
            cur->name = (xmlChar *) xmlDictLookup(doc->dict, name, -1);
        else
            cur->name = xmlStrdup(name);
    } else
        cur->name = name;

    if (value != NULL) {
        xmlNodePtr tmp;

        cur->children = xmlNewDocText(doc, value);
        cur->last = NULL;
        tmp = cur->children;
        while (tmp != NULL) {
            tmp->parent = (xmlNodePtr) cur;
            if (tmp->next == NULL)
                cur->last = tmp;
            tmp = tmp->next;
        }
    }

    /*
     * Add it at the end to preserve parsing order ...
     */
    if (node != NULL) {
        if (node->properties == NULL) {
            node->properties = cur;
        } else {
            xmlAttrPtr prev = node->properties;

            while (prev->next != NULL)
                prev = prev->next;
            prev->next = cur;
            cur->prev = prev;
        }
    }

    if ((value != NULL) && (node != NULL) &&
        (xmlIsID(node->doc, node, cur) == 1))
        xmlAddID(NULL, node->doc, value, cur);

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
        xmlRegisterNodeDefaultValue((xmlNodePtr) cur);
    return (cur);
}